

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integrators.cpp
# Opt level: O2

void __thiscall
pbrt::SimplePathIntegrator::SimplePathIntegrator
          (SimplePathIntegrator *this,int maxDepth,bool sampleLights,bool sampleBSDF,
          CameraHandle *camera,SamplerHandle *sampler,PrimitiveHandle *aggregate,
          vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_> *lights)

{
  LightHandle *pLVar1;
  pointer pLVar2;
  Allocator alloc;
  span<const_pbrt::LightHandle> lights_00;
  _Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_> local_60;
  TaggedPointer<pbrt::SimplePrimitive,_pbrt::GeometricPrimitive,_pbrt::TransformedPrimitive,_pbrt::AnimatedPrimitive,_pbrt::BVHAggregate,_pbrt::KdTreeAggregate>
  local_48;
  TaggedPointer<pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::RandomSampler,_pbrt::SobolSampler,_pbrt::StratifiedSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
  local_40;
  TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
  local_38;
  
  local_38.bits =
       (camera->
       super_TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
       ).bits;
  local_40.bits =
       (sampler->
       super_TaggedPointer<pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::RandomSampler,_pbrt::SobolSampler,_pbrt::StratifiedSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
       ).bits;
  local_48.bits =
       (aggregate->
       super_TaggedPointer<pbrt::SimplePrimitive,_pbrt::GeometricPrimitive,_pbrt::TransformedPrimitive,_pbrt::AnimatedPrimitive,_pbrt::BVHAggregate,_pbrt::KdTreeAggregate>
       ).bits;
  std::vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>::vector
            ((vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_> *)&local_60,lights);
  RayIntegrator::RayIntegrator
            (&this->super_RayIntegrator,(CameraHandle *)&local_38,(SamplerHandle *)&local_40,
             (PrimitiveHandle *)&local_48,
             (vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_> *)&local_60);
  std::_Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>::~_Vector_base(&local_60)
  ;
  (this->super_RayIntegrator).super_ImageTileIntegrator.super_Integrator._vptr_Integrator =
       (_func_int **)&PTR__SimplePathIntegrator_03011888;
  this->maxDepth = maxDepth;
  this->sampleLights = sampleLights;
  this->sampleBSDF = sampleBSDF;
  pLVar1 = (lights->super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>).
           _M_impl.super__Vector_impl_data._M_start;
  pLVar2 = (lights->super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  alloc.memoryResource = pstd::pmr::new_delete_resource();
  lights_00.n = (long)pLVar2 - (long)pLVar1 >> 3;
  lights_00.ptr = pLVar1;
  UniformLightSampler::UniformLightSampler(&this->lightSampler,lights_00,alloc);
  return;
}

Assistant:

SimplePathIntegrator::SimplePathIntegrator(int maxDepth, bool sampleLights,
                                           bool sampleBSDF, CameraHandle camera,
                                           SamplerHandle sampler,
                                           PrimitiveHandle aggregate,
                                           std::vector<LightHandle> lights)
    : RayIntegrator(camera, sampler, aggregate, lights),
      maxDepth(maxDepth),
      sampleLights(sampleLights),
      sampleBSDF(sampleBSDF),
      lightSampler(lights, Allocator()) {}